

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

socklen_t quicly_get_socklen(sockaddr *sa)

{
  short *in_RDI;
  socklen_t local_4;
  
  if (*in_RDI == 2) {
    local_4 = 0x10;
  }
  else {
    if (*in_RDI != 10) {
      __assert_fail("!\"unexpected socket type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                    ,0x175e,"socklen_t quicly_get_socklen(struct sockaddr *)");
    }
    local_4 = 0x1c;
  }
  return local_4;
}

Assistant:

socklen_t quicly_get_socklen(struct sockaddr *sa)
{
    switch (sa->sa_family) {
    case AF_INET:
        return sizeof(struct sockaddr_in);
    case AF_INET6:
        return sizeof(struct sockaddr_in6);
    default:
        assert(!"unexpected socket type");
        return 0;
    }
}